

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall
sysapi::epoll_registration::epoll_registration(epoll_registration *this,epoll_registration *rhs)

{
  uint32_t uVar1;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this->ep = rhs->ep;
  uVar1 = rhs->events;
  this->fd = rhs->fd;
  this->events = uVar1;
  std::function<void_(unsigned_int)>::function(&this->callback,&rhs->callback);
  update(this);
  rhs->ep = (epoll *)0x0;
  rhs->fd = -1;
  rhs->events = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  std::function<void_(unsigned_int)>::operator=
            (&rhs->callback,(function<void_(unsigned_int)> *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

epoll_registration::epoll_registration(epoll_registration&& rhs)
    : ep(rhs.ep)
    , fd(rhs.fd)
    , events(rhs.events)
    , callback(std::move(rhs.callback))
{
    update();
    rhs.ep = nullptr;
    rhs.fd = -1;
    rhs.events = 0;
    rhs.callback = callback_t();
}